

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
* testing::internal::edit_distance::CalculateOptimalEdits
            (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *__return_storage_ptr__,vector<unsigned_long,_std::allocator<unsigned_long>_> *left,
            vector<unsigned_long,_std::allocator<unsigned_long>_> *right)

{
  double dVar1;
  double dVar2;
  EditType EVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pdVar6;
  double dVar7;
  unsigned_long uVar8;
  pointer pdVar9;
  iterator __position;
  pointer pEVar10;
  pointer pEVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong uVar19;
  EditType *pEVar20;
  undefined4 uVar21;
  pointer pEVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  best_move;
  EditType move;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  costs;
  allocator_type local_92;
  allocator_type local_91;
  vector<double,_std::allocator<double>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  pointer local_70;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_68;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  undefined1 auVar35 [64];
  
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_90,
             ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_68);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,((long)puVar5 - (long)puVar4 >> 3) + 1,&local_90,&local_92);
  if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  puVar4 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::vector(&local_68,
           ((long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                  .super__Vector_impl_data._M_start >> 3) + 1,(allocator_type *)&local_92);
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
            *)&local_90,((long)puVar5 - (long)puVar4 >> 3) + 1,&local_68,&local_91);
  if ((void *)CONCAT44(local_68.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (EditType)
                       local_68.
                       super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                       ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_68.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (EditType)
                                     local_68.
                                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
  }
  if ((long)local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar24 = ((long)local_48.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar24 = lVar24 + (ulong)(lVar24 == 0);
    uVar23 = lVar24 + 7U & 0xfffffffffffffff8;
    lVar24 = lVar24 + -1;
    auVar30 = vpbroadcastq_avx512f();
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar37._8_4_ = 2;
    auVar37._0_8_ = 0x200000002;
    auVar37._12_4_ = 2;
    auVar37._16_4_ = 2;
    auVar37._20_4_ = 2;
    auVar37._24_4_ = 2;
    auVar37._28_4_ = 2;
    auVar33 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      uVar25 = vpcmpuq_avx512f(auVar31,auVar30,2);
      auVar34 = vcvtuqq2pd_avx512dq(auVar31);
      vpmullq_avx512dq(auVar31,auVar32);
      auVar35 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)local_48.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar24));
      auVar36._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * auVar35._8_8_;
      auVar36._0_8_ = (ulong)((byte)uVar25 & 1) * auVar35._0_8_;
      auVar36._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * auVar35._16_8_;
      auVar36._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * auVar35._24_8_;
      auVar36._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * auVar35._32_8_;
      auVar36._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * auVar35._40_8_;
      auVar36._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * auVar35._48_8_;
      auVar36._56_8_ = (uVar25 >> 7) * auVar35._56_8_;
      vscatterqpd_avx512f(ZEXT864(0) + auVar36,uVar25,auVar34);
      auVar34 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)local_90.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar24));
      auVar29._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * auVar34._8_8_;
      auVar29._0_8_ = (ulong)((byte)uVar25 & 1) * auVar34._0_8_;
      auVar29._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * auVar34._16_8_;
      auVar29._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * auVar34._24_8_;
      vpscatterqd_avx512f(ZEXT832(0) + auVar29,uVar25,auVar37);
      auVar31 = vpaddq_avx512f(auVar31,auVar33);
      uVar23 = uVar23 - 8;
    } while (uVar23 != 0);
  }
  pdVar6 = ((local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar23 = (long)((local_48.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
  if (1 < uVar23) {
    dVar7 = *local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar30 = vpbroadcastq_avx512f();
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    uVar25 = 0;
    auVar32 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar38._8_4_ = 1;
    auVar38._0_8_ = 0x100000001;
    auVar38._12_4_ = 1;
    auVar38._16_4_ = 1;
    auVar38._20_4_ = 1;
    auVar38._24_4_ = 1;
    auVar38._28_4_ = 1;
    auVar33 = vpbroadcastq_avx512f(ZEXT816(8));
    do {
      auVar34 = vpbroadcastq_avx512f();
      auVar34 = vporq_avx512f(auVar34,auVar32);
      auVar35 = vcvtuqq2pd_avx512dq(auVar31);
      uVar19 = vpcmpuq_avx512f(auVar34,auVar30,2);
      pdVar9 = pdVar6 + uVar25 + 1;
      bVar12 = (bool)((byte)uVar19 & 1);
      bVar13 = (bool)((byte)(uVar19 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar19 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar19 >> 3) & 1);
      bVar16 = (bool)((byte)(uVar19 >> 4) & 1);
      bVar17 = (bool)((byte)(uVar19 >> 5) & 1);
      bVar18 = (bool)((byte)(uVar19 >> 6) & 1);
      *pdVar9 = (double)((ulong)bVar12 * auVar35._0_8_ | (ulong)!bVar12 * (long)*pdVar9);
      pdVar9[1] = (double)((ulong)bVar13 * auVar35._8_8_ | (ulong)!bVar13 * (long)pdVar9[1]);
      pdVar9[2] = (double)((ulong)bVar14 * auVar35._16_8_ | (ulong)!bVar14 * (long)pdVar9[2]);
      pdVar9[3] = (double)((ulong)bVar15 * auVar35._24_8_ | (ulong)!bVar15 * (long)pdVar9[3]);
      pdVar9[4] = (double)((ulong)bVar16 * auVar35._32_8_ | (ulong)!bVar16 * (long)pdVar9[4]);
      pdVar9[5] = (double)((ulong)bVar17 * auVar35._40_8_ | (ulong)!bVar17 * (long)pdVar9[5]);
      pdVar9[6] = (double)((ulong)bVar18 * auVar35._48_8_ | (ulong)!bVar18 * (long)pdVar9[6]);
      pdVar9[7] = (double)((uVar19 >> 7) * auVar35._56_8_ |
                          (ulong)!SUB81(uVar19 >> 7,0) * (long)pdVar9[7]);
      auVar37 = vmovdqu32_avx512vl(auVar38);
      *(undefined1 (*) [32])((long)dVar7 + 4 + uVar25 * 4) = auVar37;
      uVar25 = uVar25 + 8;
      auVar31 = vpaddq_avx512f(auVar31,auVar33);
    } while ((uVar23 + 6 & 0xfffffffffffffff8) != uVar25);
  }
  local_70 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = (left->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  lVar24 = (long)local_50 - (long)local_70 >> 3;
  if (local_50 != local_70) {
    puVar4 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    lVar26 = (long)puVar5 - (long)puVar4 >> 3;
    lVar27 = 0;
    do {
      if (puVar5 != puVar4) {
        uVar8 = local_70[lVar27];
        lVar28 = 0;
        do {
          if (uVar8 == puVar4[lVar28]) {
            local_48.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar27 + 1].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar28 + 1] =
                 local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar28];
            uVar21 = 0;
          }
          else {
            pdVar6 = local_48.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar27 + 1].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar7 = pdVar6[lVar28];
            pdVar9 = local_48.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar27].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar1 = pdVar9[lVar28];
            dVar2 = pdVar9[lVar28 + 1];
            if ((dVar2 <= dVar7) || (dVar1 <= dVar7)) {
              if ((dVar7 <= dVar2) || (dVar1 <= dVar2)) {
                pdVar6[lVar28 + 1] = dVar1 + 1.00001;
                uVar21 = 3;
              }
              else {
                pdVar6[lVar28 + 1] = dVar2 + 1.0;
                uVar21 = 2;
              }
            }
            else {
              pdVar6[lVar28 + 1] = dVar7 + 1.0;
              uVar21 = 1;
            }
          }
          *(undefined4 *)
           ((long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(lVar27 + 1) * 3] + 4 + lVar28 * 4) = uVar21;
          lVar28 = lVar28 + 1;
        } while (lVar26 + (ulong)(lVar26 == 0) != lVar28);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != lVar24 + (ulong)(lVar24 == 0));
  }
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar4 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (right->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_78 = right;
  if (puVar5 != puVar4 || local_50 != local_70) {
    lVar26 = (long)puVar5 - (long)puVar4 >> 3;
    do {
      local_68.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(EditType *)
            ((long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar24 * 3] + lVar26 * 4);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
        ::_M_realloc_insert<testing::internal::edit_distance::EditType_const&>
                  ((vector<testing::internal::edit_distance::EditType,std::allocator<testing::internal::edit_distance::EditType>>
                    *)__return_storage_ptr__,__position,(EditType *)&local_68);
      }
      else {
        *__position._M_current =
             (EditType)
             local_68.
             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
        )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar24 = lVar24 - (ulong)((EditType)
                                local_68.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kAdd);
      lVar26 = lVar26 - (ulong)((EditType)
                                local_68.
                                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                ._M_impl.super__Vector_impl_data._M_start != kRemove);
    } while (lVar24 != 0 || lVar26 != 0);
  }
  pEVar10 = (__return_storage_ptr__->
            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pEVar11 = (__return_storage_ptr__->
            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pEVar22 = pEVar11 + -1;
  if (pEVar10 < pEVar22 && pEVar10 != pEVar11) {
    do {
      pEVar20 = pEVar10 + 1;
      EVar3 = *pEVar10;
      *pEVar10 = *pEVar22;
      *pEVar22 = EVar3;
      pEVar22 = pEVar22 + -1;
      pEVar10 = pEVar20;
    } while (pEVar20 < pEVar22);
  }
  std::
  vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
  ::~vector((vector<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>,_std::allocator<std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>_>
             *)&local_90);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<EditType> CalculateOptimalEdits(const std::vector<size_t>& left,
                                            const std::vector<size_t>& right) {
  std::vector<std::vector<double> > costs(
      left.size() + 1, std::vector<double>(right.size() + 1));
  std::vector<std::vector<EditType> > best_move(
      left.size() + 1, std::vector<EditType>(right.size() + 1));

  // Populate for empty right.
  for (size_t l_i = 0; l_i < costs.size(); ++l_i) {
    costs[l_i][0] = static_cast<double>(l_i);
    best_move[l_i][0] = kRemove;
  }
  // Populate for empty left.
  for (size_t r_i = 1; r_i < costs[0].size(); ++r_i) {
    costs[0][r_i] = static_cast<double>(r_i);
    best_move[0][r_i] = kAdd;
  }

  for (size_t l_i = 0; l_i < left.size(); ++l_i) {
    for (size_t r_i = 0; r_i < right.size(); ++r_i) {
      if (left[l_i] == right[r_i]) {
        // Found a match. Consume it.
        costs[l_i + 1][r_i + 1] = costs[l_i][r_i];
        best_move[l_i + 1][r_i + 1] = kMatch;
        continue;
      }

      const double add = costs[l_i + 1][r_i];
      const double remove = costs[l_i][r_i + 1];
      const double replace = costs[l_i][r_i];
      if (add < remove && add < replace) {
        costs[l_i + 1][r_i + 1] = add + 1;
        best_move[l_i + 1][r_i + 1] = kAdd;
      } else if (remove < add && remove < replace) {
        costs[l_i + 1][r_i + 1] = remove + 1;
        best_move[l_i + 1][r_i + 1] = kRemove;
      } else {
        // We make replace a little more expensive than add/remove to lower
        // their priority.
        costs[l_i + 1][r_i + 1] = replace + 1.00001;
        best_move[l_i + 1][r_i + 1] = kReplace;
      }
    }
  }

  // Reconstruct the best path. We do it in reverse order.
  std::vector<EditType> best_path;
  for (size_t l_i = left.size(), r_i = right.size(); l_i > 0 || r_i > 0;) {
    EditType move = best_move[l_i][r_i];
    best_path.push_back(move);
    l_i -= move != kAdd;
    r_i -= move != kRemove;
  }
  std::reverse(best_path.begin(), best_path.end());
  return best_path;
}